

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiclass.cc
# Opt level: O3

void MULTICLASS::finish_example(vw *all,example *ec,bool update_loss)

{
  uint32_t uVar1;
  int iVar2;
  namedlabels *pnVar3;
  pointer psVar4;
  _func_void_int_string_v_array<char> *p_Var5;
  v_array<char> vVar6;
  uint uVar7;
  char *pcVar8;
  undefined8 uVar9;
  int *piVar10;
  float loss;
  float fVar11;
  v_array<char> *pvVar12;
  int *piVar13;
  undefined1 *puVar14;
  undefined1 local_40 [16];
  
  uVar1 = (ec->l).multi.label;
  fVar11 = 0.0;
  if (uVar1 != (ec->pred).multiclass) {
    fVar11 = ec->weight;
  }
  loss = 0.0;
  if (uVar1 != 0xffffffff) {
    loss = fVar11;
  }
  shared_data::update(all->sd,ec->test_only,uVar1 != 0xffffffff && update_loss,loss,ec->weight,
                      ec->num_features);
  piVar10 = (all->final_prediction_sink)._begin;
  piVar13 = (all->final_prediction_sink)._end;
  if (piVar10 != piVar13) {
    pvVar12 = &ec->tag;
    do {
      iVar2 = *piVar10;
      pnVar3 = all->sd->ldict;
      if (pnVar3 == (namedlabels *)0x0) {
        (*all->print)(iVar2,(float)(ec->pred).multiclass,0.0,*pvVar12);
      }
      else {
        uVar7 = (ec->pred).multiclass - 1;
        pcVar8 = (char *)0x0;
        uVar9 = 0;
        if (uVar7 < pnVar3->K) {
          psVar4 = (pnVar3->id2name).super__Vector_base<substring,_std::allocator<substring>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar9 = psVar4[uVar7].begin;
          pcVar8 = psVar4[uVar7].end;
        }
        p_Var5 = all->print_text;
        puVar14 = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&stack0xffffffffffffffb0,uVar9,pcVar8);
        vVar6._end = (char *)pvVar12;
        vVar6._begin = (char *)ec;
        vVar6.end_array = (char *)piVar13;
        vVar6.erase_count = (size_t)puVar14;
        (*p_Var5)(iVar2,(string)*pvVar12,vVar6);
        if (puVar14 != local_40) {
          operator_delete(puVar14);
        }
      }
      piVar10 = piVar10 + 1;
    } while (piVar10 != piVar13);
  }
  print_update<&MULTICLASS::direct_print_update>(all,ec,(ec->pred).multiclass);
  VW::finish_example(all,ec);
  return;
}

Assistant:

void finish_example(vw& all, example& ec, bool update_loss)
{
  float loss = 0;
  if (ec.l.multi.label != (uint32_t)ec.pred.multiclass && ec.l.multi.label != (uint32_t)-1)
    loss = ec.weight;

  all.sd->update(ec.test_only, update_loss && (ec.l.multi.label != (uint32_t)-1), loss, ec.weight, ec.num_features);

  for (int sink : all.final_prediction_sink)
    if (!all.sd->ldict)
      all.print(sink, (float)ec.pred.multiclass, 0, ec.tag);
    else
    {
      substring ss_pred = all.sd->ldict->get(ec.pred.multiclass);
      all.print_text(sink, string(ss_pred.begin, ss_pred.end - ss_pred.begin), ec.tag);
    }

  MULTICLASS::print_update<direct_print_update>(all, ec, ec.pred.multiclass);
  VW::finish_example(all, ec);
}